

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  size_t sVar4;
  unsigned_long *local_248;
  undefined8 *local_228;
  undefined8 *local_210;
  undefined8 *local_1f0;
  int *local_1d8;
  undefined4 *local_1c0;
  long *local_1a0;
  char local_17c [4];
  int len_1;
  char bf_1 [8];
  int len;
  void *p;
  char *bf;
  int sz;
  TValue *io_2;
  TValue num_2;
  TValue *io_1;
  TValue num_1;
  TValue *io;
  TValue num;
  char *pcStack_108;
  char c;
  char *s;
  char *e;
  BuffFS buff;
  __va_list_tag *argp_local;
  char *fmt_local;
  lua_State *L_local;
  
  buff.L._4_4_ = 0;
  buff.L._0_4_ = 0;
  e = (char *)L;
  buff._208_8_ = argp;
  argp_local = (__va_list_tag *)fmt;
  while (pcVar3 = strchr((char *)argp_local,0x25), pcVar3 != (char *)0x0) {
    addstr2buff((BuffFS *)&e,(char *)argp_local,(long)pcVar3 - (long)argp_local);
    switch(pcVar3[1]) {
    case '%':
      addstr2buff((BuffFS *)&e,"%",1);
      break;
    default:
      luaG_runerror(L,"invalid option \'%%%c\' to \'lua_pushfstring\'",(ulong)(uint)(int)pcVar3[1]);
    case 'I':
      num_2._8_8_ = &io_1;
      uVar1 = *(uint *)buff._208_8_;
      if (uVar1 < 0x29) {
        local_1f0 = (undefined8 *)((long)(int)uVar1 + *(long *)(buff._208_8_ + 0x10));
        *(uint *)buff._208_8_ = uVar1 + 8;
      }
      else {
        local_1f0 = *(undefined8 **)(buff._208_8_ + 8);
        *(undefined8 **)(buff._208_8_ + 8) = local_1f0 + 1;
      }
      io_1 = (TValue *)*local_1f0;
      num_1.value_.ub = '\x03';
      addnum2buff((BuffFS *)&e,(TValue *)&io_1);
      break;
    case 'U':
      uVar1 = *(uint *)buff._208_8_;
      if (uVar1 < 0x29) {
        local_248 = (unsigned_long *)((long)(int)uVar1 + *(long *)(buff._208_8_ + 0x10));
        *(uint *)buff._208_8_ = uVar1 + 8;
      }
      else {
        local_248 = *(unsigned_long **)(buff._208_8_ + 8);
        *(unsigned_long **)(buff._208_8_ + 8) = local_248 + 1;
      }
      iVar2 = luaO_utf8esc(local_17c,*local_248);
      addstr2buff((BuffFS *)&e,bf_1 + -(long)iVar2,(long)iVar2);
      break;
    case 'c':
      uVar1 = *(uint *)buff._208_8_;
      if (uVar1 < 0x29) {
        local_1c0 = (undefined4 *)((long)(int)uVar1 + *(long *)(buff._208_8_ + 0x10));
        *(uint *)buff._208_8_ = uVar1 + 8;
      }
      else {
        local_1c0 = *(undefined4 **)(buff._208_8_ + 8);
        *(undefined4 **)(buff._208_8_ + 8) = local_1c0 + 2;
      }
      num._15_1_ = SUB41(*local_1c0,0);
      addstr2buff((BuffFS *)&e,&num.field_0xf,1);
      break;
    case 'd':
      num_1._8_8_ = &io;
      uVar1 = *(uint *)buff._208_8_;
      if (uVar1 < 0x29) {
        local_1d8 = (int *)((long)(int)uVar1 + *(long *)(buff._208_8_ + 0x10));
        *(uint *)buff._208_8_ = uVar1 + 8;
      }
      else {
        local_1d8 = *(int **)(buff._208_8_ + 8);
        *(int **)(buff._208_8_ + 8) = local_1d8 + 2;
      }
      io = (TValue *)(long)*local_1d8;
      num.value_.ub = '\x03';
      addnum2buff((BuffFS *)&e,(TValue *)&io);
      break;
    case 'f':
      uVar1 = *(uint *)(buff._208_8_ + 4);
      if (uVar1 < 0xa1) {
        local_210 = (undefined8 *)((long)(int)uVar1 + *(long *)(buff._208_8_ + 0x10));
        *(uint *)(buff._208_8_ + 4) = uVar1 + 0x10;
      }
      else {
        local_210 = *(undefined8 **)(buff._208_8_ + 8);
        *(undefined8 **)(buff._208_8_ + 8) = local_210 + 1;
      }
      io_2 = (TValue *)*local_210;
      num_2.value_.ub = '\x13';
      addnum2buff((BuffFS *)&e,(TValue *)&io_2);
      break;
    case 'p':
      __s = getbuff((BuffFS *)&e,0x20);
      uVar1 = *(uint *)buff._208_8_;
      if (uVar1 < 0x29) {
        local_228 = (undefined8 *)((long)(int)uVar1 + *(long *)(buff._208_8_ + 0x10));
        *(uint *)buff._208_8_ = uVar1 + 8;
      }
      else {
        local_228 = *(undefined8 **)(buff._208_8_ + 8);
        *(undefined8 **)(buff._208_8_ + 8) = local_228 + 1;
      }
      unique0x00012000 = *local_228;
      bf_1._0_4_ = snprintf(__s,0x20,"%p",unique0x00012000);
      buff.L._4_4_ = bf_1._0_4_ + buff.L._4_4_;
      break;
    case 's':
      uVar1 = *(uint *)buff._208_8_;
      if (uVar1 < 0x29) {
        local_1a0 = (long *)((long)(int)uVar1 + *(long *)(buff._208_8_ + 0x10));
        *(uint *)buff._208_8_ = uVar1 + 8;
      }
      else {
        local_1a0 = *(long **)(buff._208_8_ + 8);
        *(long **)(buff._208_8_ + 8) = local_1a0 + 1;
      }
      pcStack_108 = (char *)*local_1a0;
      if (pcStack_108 == (char *)0x0) {
        pcStack_108 = "(null)";
      }
      sVar4 = strlen(pcStack_108);
      addstr2buff((BuffFS *)&e,pcStack_108,sVar4);
    }
    argp_local = (__va_list_tag *)(pcVar3 + 2);
  }
  sVar4 = strlen((char *)argp_local);
  addstr2buff((BuffFS *)&e,(char *)argp_local,sVar4);
  clearbuff((BuffFS *)&e);
  return (char *)(*(long *)((L->top).offset + -0x10) + 0x18);
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  BuffFS buff;  /* holds last part of the result */
  const char *e;  /* points to next '%' */
  buff.pushed = buff.blen = 0;
  buff.L = L;
  while ((e = strchr(fmt, '%')) != NULL) {
    addstr2buff(&buff, fmt, e - fmt);  /* add 'fmt' up to '%' */
    switch (*(e + 1)) {  /* conversion specifier */
      case 's': {  /* zero-terminated string */
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        addstr2buff(&buff, s, strlen(s));
        break;
      }
      case 'c': {  /* an 'int' as a character */
        char c = cast_uchar(va_arg(argp, int));
        addstr2buff(&buff, &c, sizeof(char));
        break;
      }
      case 'd': {  /* an 'int' */
        TValue num;
        setivalue(&num, va_arg(argp, int));
        addnum2buff(&buff, &num);
        break;
      }
      case 'I': {  /* a 'lua_Integer' */
        TValue num;
        setivalue(&num, cast(lua_Integer, va_arg(argp, l_uacInt)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'f': {  /* a 'lua_Number' */
        TValue num;
        setfltvalue(&num, cast_num(va_arg(argp, l_uacNumber)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'p': {  /* a pointer */
        const int sz = 3 * sizeof(void*) + 8; /* enough space for '%p' */
        char *bf = getbuff(&buff, sz);
        void *p = va_arg(argp, void *);
        int len = lua_pointer2str(bf, sz, p);
        addsize(&buff, len);
        break;
      }
      case 'U': {  /* a 'long' as a UTF-8 sequence */
        char bf[UTF8BUFFSZ];
        int len = luaO_utf8esc(bf, va_arg(argp, long));
        addstr2buff(&buff, bf + UTF8BUFFSZ - len, len);
        break;
      }
      case '%': {
        addstr2buff(&buff, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L, "invalid option '%%%c' to 'lua_pushfstring'",
                         *(e + 1));
      }
    }
    fmt = e + 2;  /* skip '%' and the specifier */
  }
  addstr2buff(&buff, fmt, strlen(fmt));  /* rest of 'fmt' */
  clearbuff(&buff);  /* empty buffer into the stack */
  lua_assert(buff.pushed == 1);
  return getstr(tsvalue(s2v(L->top.p - 1)));
}